

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanup
          (ThreadSafeArena *this,size_t n,type_info *type)

{
  type_info *n_00;
  bool bVar1;
  AllocationPolicy *policy;
  bool local_39;
  SerialArena *local_38;
  SerialArena *arena;
  type_info *type_local;
  size_t n_local;
  ThreadSafeArena *this_local;
  
  arena = (SerialArena *)type;
  type_local = (type_info *)n;
  n_local = (size_t)this;
  bVar1 = TaggedAllocationPolicyPtr::should_record_allocs((TaggedAllocationPolicyPtr *)(this + 8));
  local_39 = false;
  if (!bVar1) {
    local_39 = GetSerialArenaFast(this,&local_38);
  }
  n_00 = type_local;
  if (local_39 == false) {
    _this_local = AllocateAlignedWithCleanupFallback(this,(size_t)type_local,(type_info *)arena);
  }
  else {
    policy = TaggedAllocationPolicyPtr::get((TaggedAllocationPolicyPtr *)(this + 8));
    _this_local = SerialArena::AllocateAlignedWithCleanup(local_38,(size_t)n_00,policy);
  }
  return _this_local;
}

Assistant:

std::pair<void*, SerialArena::CleanupNode*>
ThreadSafeArena::AllocateAlignedWithCleanup(size_t n,
                                            const std::type_info* type) {
  SerialArena* arena;
  if (PROTOBUF_PREDICT_TRUE(!alloc_policy_.should_record_allocs() &&
                            GetSerialArenaFast(&arena))) {
    return arena->AllocateAlignedWithCleanup(n, alloc_policy_.get());
  } else {
    return AllocateAlignedWithCleanupFallback(n, type);
  }
}